

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3rbu_close(sqlite3rbu *p,char **pzErrmsg)

{
  char *pcVar1;
  sqlite3_file *psVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  if (p == (sqlite3rbu *)0x0) {
    *pzErrmsg = (char *)0x0;
    return 7;
  }
  iVar3 = p->eStage;
  if (p->rc == 0) {
    if (iVar3 == 1) {
      iVar5 = sqlite3_exec(p->dbMain,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,&p->zErrmsg);
      p->rc = iVar5;
      iVar3 = p->eStage;
      if (iVar5 != 0) goto LAB_00140146;
    }
    if (iVar3 == 4) {
      psVar2 = p->pTargetFd->pReal;
      iVar3 = (*psVar2->pMethods->xSync)(psVar2,2);
      p->rc = iVar3;
      iVar3 = p->eStage;
    }
  }
LAB_00140146:
  rbuSaveState(p,iVar3);
  if ((p->rc == 0) && (p->eStage == 1)) {
    iVar3 = sqlite3_exec(p->dbRbu,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,&p->zErrmsg);
    p->rc = iVar3;
  }
  rbuObjIterFinalize(&p->objiter);
  if ((((p->zTarget == (char *)0x0) && (p->rc != 0)) && (p->dbRbu != (sqlite3 *)0x0)) &&
     (iVar3 = sqlite3_exec(p->dbRbu,"DELETE FROM stat.rbu_state",(sqlite3_callback)0x0,(void *)0x0,
                           (char **)0x0), iVar3 != 0 && p->rc == 0x65)) {
    p->rc = iVar3;
  }
  sqlite3_close(p->dbRbu);
  sqlite3_close(p->dbMain);
  if (p->zVfsName != (char *)0x0) {
    sqlite3rbu_destroy_vfs(p->zVfsName);
    p->zVfsName = (char *)0x0;
  }
  sqlite3_free(p->aBuf);
  sqlite3_free(p->aFrame);
  iVar3 = p->rc;
  if (iVar3 == 0x13) {
    if (p->zErrmsg == (char *)0x0) {
      iVar3 = 0x13;
    }
    else {
      sVar6 = strlen(p->zErrmsg);
      iVar3 = 8;
      for (uVar8 = 0; uVar9 = (ulong)uVar8, uVar9 < sVar6 - 8; uVar8 = uVar8 + 1) {
        pcVar1 = p->zErrmsg;
        if (*(long *)(pcVar1 + uVar9) == 0x5f706d695f756272) {
          uVar4 = 7;
          do {
            uVar7 = (uVar4 + iVar3) - 7;
            uVar4 = uVar4 + 1;
          } while ((byte)(pcVar1[uVar7] - 0x30U) < 10);
          memmove(pcVar1 + uVar9,pcVar1 + uVar7,(sVar6 - (uVar4 + uVar9)) + 1);
          sVar6 = sVar6 - uVar4;
        }
        iVar3 = iVar3 + 1;
      }
      iVar3 = p->rc;
    }
  }
  if (pzErrmsg == (char **)0x0) {
    sqlite3_free(p->zErrmsg);
  }
  else {
    *pzErrmsg = p->zErrmsg;
  }
  sqlite3_free(p->zState);
  sqlite3_free(p);
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3rbu_close(sqlite3rbu *p, char **pzErrmsg){
  int rc;
  if( p ){

    /* Commit the transaction to the *-oal file. */
    if( p->rc==SQLITE_OK && p->eStage==RBU_STAGE_OAL ){
      p->rc = sqlite3_exec(p->dbMain, "COMMIT", 0, 0, &p->zErrmsg);
    }

    /* Sync the db file if currently doing an incremental checkpoint */
    if( p->rc==SQLITE_OK && p->eStage==RBU_STAGE_CKPT ){
      sqlite3_file *pDb = p->pTargetFd->pReal;
      p->rc = pDb->pMethods->xSync(pDb, SQLITE_SYNC_NORMAL);
    }

    rbuSaveState(p, p->eStage);

    if( p->rc==SQLITE_OK && p->eStage==RBU_STAGE_OAL ){
      p->rc = sqlite3_exec(p->dbRbu, "COMMIT", 0, 0, &p->zErrmsg);
    }

    /* Close any open statement handles. */
    rbuObjIterFinalize(&p->objiter);

    /* If this is an RBU vacuum handle and the vacuum has either finished
    ** successfully or encountered an error, delete the contents of the 
    ** state table. This causes the next call to sqlite3rbu_vacuum() 
    ** specifying the current target and state databases to start a new
    ** vacuum from scratch.  */
    if( rbuIsVacuum(p) && p->rc!=SQLITE_OK && p->dbRbu ){
      int rc2 = sqlite3_exec(p->dbRbu, "DELETE FROM stat.rbu_state", 0, 0, 0);
      if( p->rc==SQLITE_DONE && rc2!=SQLITE_OK ) p->rc = rc2;
    }

    /* Close the open database handle and VFS object. */
    sqlite3_close(p->dbRbu);
    sqlite3_close(p->dbMain);
    assert( p->szTemp==0 );
    rbuDeleteVfs(p);
    sqlite3_free(p->aBuf);
    sqlite3_free(p->aFrame);

    rbuEditErrmsg(p);
    rc = p->rc;
    if( pzErrmsg ){
      *pzErrmsg = p->zErrmsg;
    }else{
      sqlite3_free(p->zErrmsg);
    }
    sqlite3_free(p->zState);
    sqlite3_free(p);
  }else{
    rc = SQLITE_NOMEM;
    *pzErrmsg = 0;
  }
  return rc;
}